

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void duckdb::MinMaxNOperation::
     Combine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
               (ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,_duckdb::MinMaxFixedValue<float>,_duckdb::GreaterThan>
                *source,ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,_duckdb::MinMaxFixedValue<float>,_duckdb::GreaterThan>
                        *target,AggregateInputData *aggr_input)

{
  ArenaAllocator *pAVar1;
  InvalidInputException *this;
  STORAGE_TYPE *__s;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (source->is_initialized != true) {
    return;
  }
  if (target->is_initialized == false) {
    pAVar1 = aggr_input->allocator;
    (target->heap).capacity = (source->heap).capacity;
    __s = (STORAGE_TYPE *)duckdb::ArenaAllocator::AllocateAligned((ulong)pAVar1);
    memset(__s,0,(target->heap).capacity << 4);
    (target->heap).heap = __s;
    (target->heap).size = 0;
    target->is_initialized = true;
  }
  else if ((source->heap).capacity != (target->heap).capacity) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Mismatched n values in min/max/arg_min/arg_max","");
    duckdb::InvalidInputException::InvalidInputException(this,(string *)local_48);
    __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  BinaryAggregateHeap<float,_double,_duckdb::GreaterThan>::Insert
            (&target->heap,aggr_input->allocator,&source->heap);
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &aggr_input) {
		if (!source.is_initialized) {
			// source is empty, nothing to do
			return;
		}

		if (!target.is_initialized) {
			target.Initialize(aggr_input.allocator, source.heap.Capacity());
		} else if (source.heap.Capacity() != target.heap.Capacity()) {
			throw InvalidInputException("Mismatched n values in min/max/arg_min/arg_max");
		}

		// Merge the heaps
		target.heap.Insert(aggr_input.allocator, source.heap);
	}